

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

PagesConfig * __thiscall QPDFJob::PagesConfig::password(PagesConfig *this,string *arg)

{
  element_type *peVar1;
  pointer pPVar2;
  allocator<char> local_41;
  string local_40;
  
  peVar1 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pPVar2 = *(pointer *)
            ((long)&(peVar1->page_specs).
                    super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if ((peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"in --pages, --password must follow a file name",&local_41);
    usage(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pPVar2 = *(pointer *)
              ((long)&(((this->config->o->m).
                        super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
  }
  if (pPVar2[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"--password already specified for this file",&local_41);
    usage(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  QUtil::make_shared_cstr((QUtil *)&local_40,arg);
  std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&pPVar2[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  return this;
}

Assistant:

QPDFJob::PagesConfig*
QPDFJob::PagesConfig::password(std::string const& arg)
{
    if (config->o.m->page_specs.empty()) {
        QTC::TC("qpdf", "QPDFJob misplaced pages password");
        usage("in --pages, --password must follow a file name");
    }
    auto& last = config->o.m->page_specs.back();
    if (last.password) {
        QTC::TC("qpdf", "QPDFJob duplicated pages password");
        usage("--password already specified for this file");
    }
    last.password = QUtil::make_shared_cstr(arg);
    return this;
}